

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope_test.cpp
# Opt level: O1

void __thiscall
reflect_scope_test_DefaultConstructor_Test::TestBody
          (reflect_scope_test_DefaultConstructor_Test *this)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  void *pvVar12;
  AssertHelperData *pAVar13;
  char *pcVar14;
  undefined1 auVar15 [16];
  AssertionResult AVar16;
  size_t size;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  AssertHelper local_60;
  internal local_58 [8];
  undefined8 *local_50;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper local_40;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_68._M_head_impl = local_68._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_text();
  uVar5 = log_policy_schedule_sync();
  uVar6 = log_policy_storage_sequential();
  uVar7 = log_policy_stream_stdio(_stdout);
  local_60.data_._0_4_ = log_configure_impl("metacall",4,uVar4,uVar5,uVar6,uVar7);
  testing::internal::CmpHelperEQ<int,int>
            (local_58,"(int)0",
             "(int)log_configure_impl(\"metacall\", 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&local_68,(int *)&local_60);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x82,pcVar14);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  puVar1 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar1);
  }
  local_68._M_head_impl = local_68._M_head_impl & 0xffffffff00000000;
  uVar2 = serial_initialize();
  local_60.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_58,"(int)0","(int)serial_initialize()",(int *)&local_68,(int *)&local_60);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x85,pcVar14);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  puVar1 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar1);
  }
  uVar4 = serial_create("rapid_json");
  pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           scope_create("test");
  local_60.data_ = (AssertHelperData *)0x0;
  local_68._M_head_impl = pbVar8;
  testing::internal::CmpHelperNE<scope_type*,scope_type*>
            (local_58,"(scope)sp","(scope)__null",(scope_type **)&local_68,(scope_type **)&local_60)
  ;
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x8c,pcVar14);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  puVar1 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar1);
  }
  pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           type_create(1,"char",0,0);
  pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            type_create(3,"int",0,0);
  pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            type_create(0xb,"ptr",0,0);
  local_60.data_ = (AssertHelperData *)0x0;
  local_68._M_head_impl = pbVar9;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            (local_58,"(type)char_type","(type)__null",(type_type **)&local_68,
             (type_type **)&local_60);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x92,pcVar14);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  puVar1 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar1);
  }
  local_60.data_ = (AssertHelperData *)0x0;
  local_68._M_head_impl = pbVar10;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            (local_58,"(type)int_type","(type)__null",(type_type **)&local_68,
             (type_type **)&local_60);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x93,pcVar14);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  puVar1 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar1);
  }
  local_60.data_ = (AssertHelperData *)0x0;
  local_68._M_head_impl = pbVar11;
  AVar16 = testing::internal::CmpHelperNE<type_type*,type_type*>
                     (local_58,"(type)ptr_type","(type)__null",(type_type **)&local_68,
                      (type_type **)&local_60);
  uVar2 = AVar16._0_4_;
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x94,pcVar14);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    uVar2 = extraout_EAX;
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar2 = (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  puVar1 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar1);
    uVar2 = extraout_EAX_00;
  }
  auVar15._0_4_ = -(uint)((int)((ulong)pbVar8 >> 0x20) == 0 && (int)pbVar8 == 0);
  auVar15._4_4_ = -(uint)((int)pbVar9 == 0 && (int)((ulong)pbVar9 >> 0x20) == 0);
  auVar15._8_4_ = -(uint)((int)((ulong)pbVar10 >> 0x20) == 0 && (int)pbVar10 == 0);
  auVar15._12_4_ = -(uint)((int)pbVar11 == 0 && (int)((ulong)pbVar11 >> 0x20) == 0);
  iVar3 = movmskps(uVar2,auVar15);
  if (iVar3 == 0) {
    local_48 = pbVar11;
    pvVar12 = malloc(8);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              function_create("example",3,pvVar12,function_example_singleton);
    local_60.data_ = (AssertHelperData *)0x0;
    local_68._M_head_impl = pbVar11;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              (local_58,"(function)f1","(function)__null",(function_type **)&local_68,
               (function_type **)&local_60);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = (char *)*local_50;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0x9e,pcVar14);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    puVar1 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,0,"c",pbVar9);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,1,"i",pbVar10);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,2,"p",local_48);
      uVar5 = function_name(pbVar11);
      uVar6 = value_create_function(pbVar11);
      uVar2 = scope_define(pbVar8,uVar5,uVar6);
      local_68._M_head_impl._0_4_ = uVar2;
      local_60.data_ = local_60.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"(int)scope_define(sp, function_name(f1), value_create_function(f1))",
                 "(int)0",(int *)&local_68,(int *)&local_60);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = (char *)*local_50;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xa6,pcVar14);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      puVar1 = local_50;
      if (local_50 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_50 != local_50 + 2) {
          operator_delete((undefined8 *)*local_50);
        }
        operator_delete(puVar1);
      }
    }
    pvVar12 = malloc(8);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              function_create("example_asd",3,pvVar12,function_example_singleton);
    local_60.data_ = (AssertHelperData *)0x0;
    local_68._M_head_impl = pbVar11;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              (local_58,"(function)f2","(function)__null",(function_type **)&local_68,
               (function_type **)&local_60);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = (char *)*local_50;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xad,pcVar14);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    puVar1 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,0,"e",pbVar9);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,1,"o",pbVar10);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,2,"u",local_48);
      uVar5 = function_name(pbVar11);
      uVar6 = value_create_function(pbVar11);
      uVar2 = scope_define(pbVar8,uVar5,uVar6);
      local_68._M_head_impl._0_4_ = uVar2;
      local_60.data_ = local_60.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"(int)scope_define(sp, function_name(f2), value_create_function(f2))",
                 "(int)0",(int *)&local_68,(int *)&local_60);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = (char *)*local_50;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xb5,pcVar14);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      puVar1 = local_50;
      if (local_50 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_50 != local_50 + 2) {
          operator_delete((undefined8 *)*local_50);
        }
        operator_delete(puVar1);
      }
    }
    pvVar12 = malloc(8);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              function_create("example_ret",3,pvVar12,function_example_singleton);
    local_60.data_ = (AssertHelperData *)0x0;
    local_68._M_head_impl = pbVar11;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              (local_58,"(function)f3","(function)__null",(function_type **)&local_68,
               (function_type **)&local_60);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = (char *)*local_50;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xbc,pcVar14);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    puVar1 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar5 = function_signature(pbVar11);
      signature_set_return(uVar5,pbVar10);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,0,"e",pbVar9);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,1,"o",pbVar10);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,2,"u",local_48);
      uVar5 = function_name(pbVar11);
      uVar6 = value_create_function(pbVar11);
      uVar2 = scope_define(pbVar8,uVar5,uVar6);
      local_68._M_head_impl._0_4_ = uVar2;
      local_60.data_ = local_60.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"(int)scope_define(sp, function_name(f3), value_create_function(f3))",
                 "(int)0",(int *)&local_68,(int *)&local_60);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = (char *)*local_50;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xc5,pcVar14);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      puVar1 = local_50;
      if (local_50 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_50 != local_50 + 2) {
          operator_delete((undefined8 *)*local_50);
        }
        operator_delete(puVar1);
      }
    }
    pvVar12 = malloc(8);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              function_create("example_duck",3,pvVar12,function_example_singleton);
    local_60.data_ = (AssertHelperData *)0x0;
    local_68._M_head_impl = pbVar11;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              (local_58,"(function)f4","(function)__null",(function_type **)&local_68,
               (function_type **)&local_60);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = (char *)*local_50;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xcc,pcVar14);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    puVar1 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,0,"e",0);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,1,"o",0);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,2,"u",0);
      uVar5 = function_name(pbVar11);
      uVar6 = value_create_function(pbVar11);
      uVar2 = scope_define(pbVar8,uVar5,uVar6);
      local_68._M_head_impl._0_4_ = uVar2;
      local_60.data_ = local_60.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"(int)scope_define(sp, function_name(f4), value_create_function(f4))",
                 "(int)0",(int *)&local_68,(int *)&local_60);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = (char *)*local_50;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xd4,pcVar14);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      puVar1 = local_50;
      if (local_50 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_50 != local_50 + 2) {
          operator_delete((undefined8 *)*local_50);
        }
        operator_delete(puVar1);
      }
    }
    pvVar12 = malloc(8);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              function_create("example_duck_ret",3,pvVar12,function_example_singleton);
    local_60.data_ = (AssertHelperData *)0x0;
    local_68._M_head_impl = pbVar11;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              (local_58,"(function)f5","(function)__null",(function_type **)&local_68,
               (function_type **)&local_60);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = (char *)*local_50;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xdb,pcVar14);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    puVar1 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar5 = function_signature(pbVar11);
      signature_set_return(uVar5,pbVar10);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,0,"asdfe",0);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,1,"do",0);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,2,"dafu",0);
      uVar5 = function_name(pbVar11);
      uVar6 = value_create_function(pbVar11);
      uVar2 = scope_define(pbVar8,uVar5,uVar6);
      local_68._M_head_impl._0_4_ = uVar2;
      local_60.data_ = local_60.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"(int)scope_define(sp, function_name(f5), value_create_function(f5))",
                 "(int)0",(int *)&local_68,(int *)&local_60);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = (char *)*local_50;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xe4,pcVar14);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      puVar1 = local_50;
      if (local_50 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_50 != local_50 + 2) {
          operator_delete((undefined8 *)*local_50);
        }
        operator_delete(puVar1);
      }
    }
    pvVar12 = malloc(8);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              function_create("example_duck_mix",4,pvVar12,function_example_singleton);
    local_60.data_ = (AssertHelperData *)0x0;
    local_68._M_head_impl = pbVar11;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              (local_58,"(function)f6","(function)__null",(function_type **)&local_68,
               (function_type **)&local_60);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = (char *)*local_50;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xeb,pcVar14);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    puVar1 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,0,"asdfe",0);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,1,"do",pbVar10);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,2,"dafu",0);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,3,"dafu",local_48);
      uVar5 = function_name(pbVar11);
      uVar6 = value_create_function(pbVar11);
      uVar2 = scope_define(pbVar8,uVar5,uVar6);
      local_68._M_head_impl._0_4_ = uVar2;
      local_60.data_ = local_60.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"(int)scope_define(sp, function_name(f6), value_create_function(f6))",
                 "(int)0",(int *)&local_68,(int *)&local_60);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = (char *)*local_50;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0xf4,pcVar14);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      puVar1 = local_50;
      if (local_50 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_50 != local_50 + 2) {
          operator_delete((undefined8 *)*local_50);
        }
        operator_delete(puVar1);
      }
    }
    pvVar12 = malloc(8);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              function_create("example_duck_mix_ret",4,pvVar12,function_example_singleton);
    local_60.data_ = (AssertHelperData *)0x0;
    local_68._M_head_impl = pbVar11;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              (local_58,"(function)f7","(function)__null",(function_type **)&local_68,
               (function_type **)&local_60);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = (char *)*local_50;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0xfb,pcVar14);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    puVar1 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar5 = function_signature(pbVar11);
      signature_set_return(uVar5,pbVar10);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,0,"asdfe",pbVar10);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,1,"do",0);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,2,"dafu",local_48);
      uVar5 = function_signature(pbVar11);
      signature_set(uVar5,3,"dafufs",0);
      uVar5 = function_name(pbVar11);
      uVar6 = value_create_function(pbVar11);
      uVar2 = scope_define(pbVar8,uVar5,uVar6);
      local_68._M_head_impl._0_4_ = uVar2;
      local_60.data_ = local_60.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"(int)scope_define(sp, function_name(f7), value_create_function(f7))",
                 "(int)0",(int *)&local_68,(int *)&local_60);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = (char *)*local_50;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0x105,pcVar14);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      puVar1 = local_50;
      if (local_50 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_50 != local_50 + 2) {
          operator_delete((undefined8 *)*local_50);
        }
        operator_delete(puVar1);
      }
    }
    pvVar12 = malloc(8);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              function_create("example_empty_ret",0,pvVar12,function_example_singleton);
    local_60.data_ = (AssertHelperData *)0x0;
    local_68._M_head_impl = pbVar11;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              (local_58,"(function)f8","(function)__null",(function_type **)&local_68,
               (function_type **)&local_60);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = (char *)*local_50;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0x10c,pcVar14);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    puVar1 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar5 = function_signature(pbVar11);
      signature_set_return(uVar5,pbVar10);
      uVar5 = function_name(pbVar11);
      uVar6 = value_create_function(pbVar11);
      uVar2 = scope_define(pbVar8,uVar5,uVar6);
      local_68._M_head_impl._0_4_ = uVar2;
      local_60.data_ = local_60.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"(int)scope_define(sp, function_name(f8), value_create_function(f8))",
                 "(int)0",(int *)&local_68,(int *)&local_60);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = (char *)*local_50;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0x112,pcVar14);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      puVar1 = local_50;
      if (local_50 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_50 != local_50 + 2) {
          operator_delete((undefined8 *)*local_50);
        }
        operator_delete(puVar1);
      }
    }
    pvVar12 = malloc(8);
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              function_create("example_empty",0,pvVar12,function_example_singleton);
    local_60.data_ = (AssertHelperData *)0x0;
    local_68._M_head_impl = pbVar11;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              (local_58,"(function)f9","(function)__null",(function_type **)&local_68,
               (function_type **)&local_60);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = (char *)*local_50;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0x119,pcVar14);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    puVar1 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
    if (pbVar11 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      uVar5 = function_name(pbVar11);
      uVar6 = value_create_function(pbVar11);
      uVar2 = scope_define(pbVar8,uVar5,uVar6);
      local_68._M_head_impl._0_4_ = uVar2;
      local_60.data_ = local_60.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"(int)scope_define(sp, function_name(f9), value_create_function(f9))",
                 "(int)0",(int *)&local_68,(int *)&local_60);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = (char *)*local_50;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                   ,0x11d,pcVar14);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      puVar1 = local_50;
      if (local_50 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_50 != local_50 + 2) {
          operator_delete((undefined8 *)*local_50);
        }
        operator_delete(puVar1);
      }
    }
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar13 = (AssertHelperData *)scope_metadata(pbVar8);
    local_60.data_ = (AssertHelperData *)0x0;
    local_40.data_ = pAVar13;
    testing::internal::CmpHelperNE<void*,void*>
              (local_58,"(value)__null","(value)v",&local_60.data_,&local_40.data_);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_50 == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = (char *)*local_50;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                 ,0x125,pcVar14);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_60.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
    puVar1 = local_50;
    local_38 = pbVar8;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
    uVar5 = memory_allocator_std(malloc,realloc,free);
    uVar6 = serial_serialize(uVar4,pAVar13,&local_68,uVar5);
    log_write_impl_va("metacall",299,"TestBody",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
                      ,0,"Scope serialization info: %s",uVar6);
    memory_allocator_deallocate(uVar5,uVar6);
    memory_allocator_destroy(uVar5);
    value_type_destroy(pAVar13);
    type_destroy(pbVar9);
    type_destroy(pbVar10);
    type_destroy(local_48);
    scope_destroy(local_38);
  }
  local_68._M_head_impl = local_68._M_head_impl & 0xffffffff00000000;
  uVar2 = serial_clear(uVar4);
  local_60.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_58,"(int)0","(int)serial_clear(s)",(int *)&local_68,(int *)&local_60);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (undefined8 *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_scope_test/source/reflect_scope_test.cpp"
               ,0x13c,pcVar14);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(local_50);
  }
  serial_destroy();
  return;
}

Assistant:

TEST_F(reflect_scope_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	// Initialize serial
	EXPECT_EQ((int)0, (int)serial_initialize());

	// Create serial
	serial s = serial_create("rapid_json");

	scope sp = scope_create("test");

	EXPECT_NE((scope)sp, (scope)NULL);

	type char_type = type_create(TYPE_CHAR, "char", NULL, NULL);
	type int_type = type_create(TYPE_INT, "int", NULL, NULL);
	type ptr_type = type_create(TYPE_PTR, "ptr", NULL, NULL);

	EXPECT_NE((type)char_type, (type)NULL);
	EXPECT_NE((type)int_type, (type)NULL);
	EXPECT_NE((type)ptr_type, (type)NULL);

	if (sp && char_type != NULL && int_type != NULL && ptr_type != NULL)
	{
		function f1, f2, f3, f4, f5, f6, f7, f8, f9;

		function_impl_example example_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f1 = function_create("example", 3, example_impl, &function_example_singleton);

		EXPECT_NE((function)f1, (function)NULL);

		if (f1 != NULL)
		{
			signature_set(function_signature(f1), 0, "c", char_type);
			signature_set(function_signature(f1), 1, "i", int_type);
			signature_set(function_signature(f1), 2, "p", ptr_type);

			EXPECT_EQ((int)scope_define(sp, function_name(f1), value_create_function(f1)), (int)0);
		}

		function_impl_example example_asd_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f2 = function_create("example_asd", 3, example_asd_impl, &function_example_singleton);

		EXPECT_NE((function)f2, (function)NULL);

		if (f2 != NULL)
		{
			signature_set(function_signature(f2), 0, "e", char_type);
			signature_set(function_signature(f2), 1, "o", int_type);
			signature_set(function_signature(f2), 2, "u", ptr_type);

			EXPECT_EQ((int)scope_define(sp, function_name(f2), value_create_function(f2)), (int)0);
		}

		function_impl_example example_ret_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f3 = function_create("example_ret", 3, example_ret_impl, &function_example_singleton);

		EXPECT_NE((function)f3, (function)NULL);

		if (f3 != NULL)
		{
			signature_set_return(function_signature(f3), int_type);
			signature_set(function_signature(f3), 0, "e", char_type);
			signature_set(function_signature(f3), 1, "o", int_type);
			signature_set(function_signature(f3), 2, "u", ptr_type);

			EXPECT_EQ((int)scope_define(sp, function_name(f3), value_create_function(f3)), (int)0);
		}

		function_impl_example example_duck_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f4 = function_create("example_duck", 3, example_duck_impl, &function_example_singleton);

		EXPECT_NE((function)f4, (function)NULL);

		if (f4 != NULL)
		{
			signature_set(function_signature(f4), 0, "e", NULL);
			signature_set(function_signature(f4), 1, "o", NULL);
			signature_set(function_signature(f4), 2, "u", NULL);

			EXPECT_EQ((int)scope_define(sp, function_name(f4), value_create_function(f4)), (int)0);
		}

		function_impl_example example_duck_ret_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f5 = function_create("example_duck_ret", 3, example_duck_ret_impl, &function_example_singleton);

		EXPECT_NE((function)f5, (function)NULL);

		if (f5 != NULL)
		{
			signature_set_return(function_signature(f5), int_type);
			signature_set(function_signature(f5), 0, "asdfe", NULL);
			signature_set(function_signature(f5), 1, "do", NULL);
			signature_set(function_signature(f5), 2, "dafu", NULL);

			EXPECT_EQ((int)scope_define(sp, function_name(f5), value_create_function(f5)), (int)0);
		}

		function_impl_example example_duck_mix_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f6 = function_create("example_duck_mix", 4, example_duck_mix_impl, &function_example_singleton);

		EXPECT_NE((function)f6, (function)NULL);

		if (f6 != NULL)
		{
			signature_set(function_signature(f6), 0, "asdfe", NULL);
			signature_set(function_signature(f6), 1, "do", int_type);
			signature_set(function_signature(f6), 2, "dafu", NULL);
			signature_set(function_signature(f6), 3, "dafu", ptr_type);

			EXPECT_EQ((int)scope_define(sp, function_name(f6), value_create_function(f6)), (int)0);
		}

		function_impl_example example_duck_mix_ret_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f7 = function_create("example_duck_mix_ret", 4, example_duck_mix_ret_impl, &function_example_singleton);

		EXPECT_NE((function)f7, (function)NULL);

		if (f7 != NULL)
		{
			signature_set_return(function_signature(f7), int_type);
			signature_set(function_signature(f7), 0, "asdfe", int_type);
			signature_set(function_signature(f7), 1, "do", NULL);
			signature_set(function_signature(f7), 2, "dafu", ptr_type);
			signature_set(function_signature(f7), 3, "dafufs", NULL);

			EXPECT_EQ((int)scope_define(sp, function_name(f7), value_create_function(f7)), (int)0);
		}

		function_impl_example example_empty_ret_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f8 = function_create("example_empty_ret", 0, example_empty_ret_impl, &function_example_singleton);

		EXPECT_NE((function)f8, (function)NULL);

		if (f8 != NULL)
		{
			signature_set_return(function_signature(f8), int_type);

			EXPECT_EQ((int)scope_define(sp, function_name(f8), value_create_function(f8)), (int)0);
		}

		function_impl_example example_empty_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f9 = function_create("example_empty", 0, example_empty_impl, &function_example_singleton);

		EXPECT_NE((function)f9, (function)NULL);

		if (f9 != NULL)
		{
			EXPECT_EQ((int)scope_define(sp, function_name(f9), value_create_function(f9)), (int)0);
		}

		{
			size_t size = 0;

			value v = scope_metadata(sp);

			EXPECT_NE((value)NULL, (value)v);

			memory_allocator allocator = memory_allocator_std(&std::malloc, &std::realloc, &std::free);

			char *str = serial_serialize(s, v, &size, allocator);

			log_write("metacall", LOG_LEVEL_DEBUG, "Scope serialization info: %s", str);

			memory_allocator_deallocate(allocator, str);

			memory_allocator_destroy(allocator);

			value_type_destroy(v);
		}

		type_destroy(char_type);
		type_destroy(int_type);
		type_destroy(ptr_type);

		scope_destroy(sp);
	}

	// Clear serial
	EXPECT_EQ((int)0, (int)serial_clear(s));

	// Destroy serial
	serial_destroy();
}